

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_graph_compute(ggml_context *ctx,ggml_cgraph *cgraph)

{
  int *piVar1;
  uint uVar2;
  ggml_type gVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ggml_cgraph *pgVar6;
  ggml_context *ctx_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ggml_tensor *pgVar10;
  sbyte sVar11;
  void *pvVar12;
  ggml_cgraph *pgVar13;
  pthread_t *ppVar14;
  int iVar15;
  size_t sVar16;
  size_t *__th;
  long lVar17;
  size_t *psVar18;
  pthread_t *__newthread;
  long lVar19;
  pthread_t *ppVar20;
  uint *puVar21;
  long lVar22;
  undefined8 uStack_90;
  pthread_t pStack_88;
  ggml_compute_params local_80;
  undefined8 local_60;
  ggml_cgraph *local_58;
  ggml_context *local_50;
  ulong local_48;
  long local_40;
  int local_38;
  ushort local_34;
  
  ppVar14 = &pStack_88;
  local_50 = ctx;
  uVar2 = cgraph->n_threads;
  local_48 = (ulong)uVar2;
  local_58 = cgraph;
  if ((int)uVar2 < 1) {
    cgraph->n_threads = 8;
    local_40 = 0x800000000;
    local_38 = 0;
    local_48 = 8;
LAB_0012199b:
    local_38 = 0;
    uVar8 = (ulong)((int)local_48 - 1);
    uVar9 = uVar8 * 0x38 + 0xf & 0xfffffffffffffff0;
    lVar19 = -uVar9;
    ppVar14 = (pthread_t *)((long)&pStack_88 + lVar19);
    LOCK();
    local_34 = 1;
    UNLOCK();
    local_60 = CONCAT71((int7)(uVar9 >> 8),1);
    uVar9 = 0;
    __newthread = ppVar14;
    do {
      ppVar20 = ppVar14;
      if (uVar8 == uVar9) goto LAB_00121a8b;
      pgVar10 = local_58->work;
      if (pgVar10 == (ggml_tensor *)0x0) {
        uVar7 = 0;
        pvVar12 = (void *)0x0;
      }
      else {
        uVar7 = ((long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                 (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * GGML_TYPE_SIZE[pgVar10->type]) /
                (ulong)(long)GGML_BLCK_SIZE[pgVar10->type];
        pvVar12 = pgVar10->data;
      }
      *__newthread = 0;
      *(undefined4 *)(__newthread + 1) = 1;
      uVar9 = uVar9 + 1;
      *(int *)((long)__newthread + 0xc) = (int)uVar9;
      *(int *)(__newthread + 2) = (int)local_48;
      __newthread[3] = uVar7;
      __newthread[4] = (pthread_t)pvVar12;
      __newthread[5] = 0;
      __newthread[6] = (pthread_t)&local_40;
      *(undefined8 *)((long)&uStack_90 + lVar19) = 0x121a76;
      iVar15 = pthread_create(__newthread,(pthread_attr_t *)0x0,ggml_graph_compute_thread,
                              __newthread);
      __newthread = __newthread + 7;
    } while (iVar15 == 0);
    *(undefined8 *)((long)&uStack_90 + lVar19) = 0x121a87;
    ggml_graph_compute_cold_1();
  }
  else {
    local_40 = (ulong)uVar2 << 0x20;
    local_38 = 0;
    local_34 = 0;
    if (uVar2 != 1) goto LAB_0012199b;
    local_48 = 1;
    local_60 = 0;
    ppVar20 = (pthread_t *)0x0;
  }
LAB_00121a8b:
  ctx_00 = local_50;
  pgVar6 = local_58;
  __th = (size_t *)(long)local_58->n_nodes;
  if ((long)__th < 1) {
LAB_00121fd3:
    if ((char)local_60 != '\0') {
      LOCK();
      UNLOCK();
      LOCK();
      local_34 = 0x101;
      UNLOCK();
      if (1 < (int)local_48) {
        pgVar13 = (ggml_cgraph *)((ulong)((int)local_48 - 1) * 0x38);
        puVar21 = (uint *)0x0;
        do {
          __th = *(size_t **)((long)ppVar20 + (long)puVar21);
          ppVar14[-1] = 0x122001;
          iVar15 = pthread_join((pthread_t)__th,(void **)0x0);
          if (iVar15 != 0) {
            ppVar14[-1] = 0x122096;
            ggml_graph_compute_cold_9();
LAB_00122096:
            ppVar14[-1] = 0x12209b;
            ggml_graph_compute_cold_6();
LAB_0012209b:
            ppVar14[-1] = 0x1220a0;
            ggml_graph_compute_cold_3();
LAB_001220a0:
            ppVar14[-1] = 0x1220a5;
            ggml_graph_compute_cold_4();
LAB_001220a5:
            ppVar14[-1] = 0x1220aa;
            ggml_graph_compute_cold_5();
switchD_00121ad2_caseD_23:
            ppVar14[-1] = 0x1220af;
            ggml_graph_compute_cold_2();
            goto LAB_001220af;
          }
          puVar21 = puVar21 + 0xe;
        } while ((long)pgVar13 - (long)puVar21 != 0);
      }
    }
    local_58->perf_runs = local_58->perf_runs + 1;
    return;
  }
  iVar15 = (int)local_48;
  psVar18 = (size_t *)0x0;
  puVar21 = &switchD_00121c44::switchdataD_0012fec4;
  uVar9 = 0;
LAB_00121ab9:
  pgVar10 = local_58->nodes[(long)psVar18];
  pgVar13 = local_58;
  switch(pgVar10->op) {
  case GGML_OP_NONE:
  case GGML_OP_DUP:
  case GGML_OP_SUB:
  case GGML_OP_MUL:
  case GGML_OP_DIV:
  case GGML_OP_SQR:
  case GGML_OP_SQRT:
  case GGML_OP_SUM:
  case GGML_OP_MEAN:
  case GGML_OP_REPEAT:
  case GGML_OP_ABS:
  case GGML_OP_SGN:
  case GGML_OP_NEG:
  case GGML_OP_STEP:
  case GGML_OP_RELU:
  case GGML_OP_CPY:
  case GGML_OP_RESHAPE:
  case GGML_OP_VIEW:
  case GGML_OP_PERMUTE:
  case GGML_OP_TRANSPOSE:
  case GGML_OP_GET_ROWS:
  case GGML_OP_DIAG_MASK_INF:
  case GGML_OP_ROPE:
    pgVar10->n_tasks = 1;
    break;
  case GGML_OP_ADD:
  case GGML_OP_GELU:
  case GGML_OP_SILU:
  case GGML_OP_NORM:
  case GGML_OP_RMS_NORM:
  case GGML_OP_SCALE:
  case GGML_OP_SOFT_MAX:
    pgVar10->n_tasks = iVar15;
    break;
  case GGML_OP_MUL_MAT:
    pgVar10->n_tasks = iVar15;
    pgVar5 = pgVar10->src0;
    if (pgVar5->nb[0] <= pgVar5->nb[1]) {
      switch(pgVar5->type) {
      case GGML_TYPE_Q4_0:
        pgVar10 = pgVar10->src1;
        if (pgVar10->type != GGML_TYPE_F32) goto switchD_00121c44_caseD_2;
        uVar8 = (long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * 0x14;
        break;
      case GGML_TYPE_Q4_1:
        pgVar10 = pgVar10->src1;
        if (pgVar10->type != GGML_TYPE_F32) goto switchD_00121c44_caseD_2;
        uVar8 = (long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * 0x18;
        break;
      default:
        goto switchD_00121c44_caseD_2;
      case GGML_TYPE_F16:
        pgVar10 = pgVar10->src1;
        if (pgVar10->type == GGML_TYPE_F32) {
          uVar8 = (long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                  (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * 2;
          goto LAB_00121cf5;
        }
        goto switchD_00121c44_caseD_2;
      case GGML_TYPE_F32:
        if (pgVar10->src1->type == GGML_TYPE_F32) goto LAB_00121cbc;
        goto switchD_00121c44_caseD_2;
      }
      uVar8 = uVar8 >> 5;
      goto LAB_00121cf5;
    }
    uVar8 = (((long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
              (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * GGML_TYPE_SIZE[pgVar10->type]) /
            (ulong)(long)GGML_BLCK_SIZE[pgVar10->type]) * (long)iVar15;
    goto LAB_00121cf5;
  case GGML_OP_CONV_1D_1S:
  case GGML_OP_CONV_1D_2S:
    pgVar10->n_tasks = iVar15;
    pgVar5 = pgVar10->src0;
    if (pgVar5->ne[3] != 1) goto LAB_0012209b;
    pgVar10 = pgVar10->src1;
    if (pgVar10->ne[2] != 1) goto LAB_001220a0;
    if (pgVar10->ne[3] != 1) goto LAB_001220a5;
    uVar2 = pgVar5->ne[0];
    pgVar13 = (ggml_cgraph *)(ulong)uVar2;
    if (pgVar5->type == GGML_TYPE_F32) {
      sVar11 = 2;
    }
    else {
      if (pgVar5->type != GGML_TYPE_F16) goto LAB_00122096;
      sVar11 = 1;
    }
    if (pgVar10->type != GGML_TYPE_F32) goto LAB_00122096;
    uVar8 = (long)(int)(((uVar2 - ((int)uVar2 >> 0x1f) & 0xfffffffe) + pgVar10->ne[0]) *
                        pgVar10->ne[1] +
                       pgVar5->ne[2] * uVar2 * (pgVar5->ne[1] + 0x1fU & 0xffffffe0)) << sVar11;
    if (uVar9 <= uVar8) {
      uVar9 = uVar8;
    }
    break;
  case GGML_OP_FLASH_ATTN:
    pgVar10->n_tasks = iVar15;
    uVar8 = (long)pgVar10->src1->ne[1] + 3U & 0xfffffffffffffffc;
    gVar3 = pgVar10->src1->type;
    if (gVar3 == GGML_TYPE_F16) {
      uVar8 = (ulong)(int)uVar8;
    }
    else if (gVar3 != GGML_TYPE_F32) goto LAB_00121cbc;
    goto LAB_00121c7b;
  case GGML_OP_FLASH_FF:
    pgVar10->n_tasks = iVar15;
    if (1 < pgVar10->src1->type - GGML_TYPE_F16) {
LAB_00121cbc:
      uVar8 = 0;
      goto LAB_00121cf5;
    }
    uVar8 = (ulong)pgVar10->src1->ne[1];
LAB_00121c7b:
    uVar8 = uVar8 * (long)iVar15 * 8;
LAB_00121cf5:
    if (uVar9 <= uVar8) {
      uVar9 = uVar8;
    }
    break;
  case GGML_OP_COUNT:
    goto switchD_00121ad2_caseD_23;
  }
  psVar18 = (size_t *)((long)psVar18 + 1);
  if (__th == psVar18) goto code_r0x00121d08;
  goto LAB_00121ab9;
code_r0x00121d08:
  if (local_58->work == (ggml_tensor *)0x0) {
    if (uVar9 != 0) {
      sVar16 = uVar9 + (long)(iVar15 * 0x40 + -0x40);
      local_58->work_size = sVar16;
      local_80.type = (ggml_task_type)sVar16;
      ppVar14[-1] = 0x122071;
      pgVar10 = ggml_new_tensor_impl(ctx_00,GGML_TYPE_I8,1,(int *)&local_80,(void *)0x0);
      pgVar6->work = pgVar10;
      if (pgVar6->n_nodes < 1) goto LAB_00121fd3;
    }
  }
  else {
    __th = GGML_TYPE_SIZE;
    pgVar13 = local_58;
    if (local_58->work_size < uVar9) {
LAB_001220af:
      ppVar14[-1] = 0x1220b4;
      ggml_graph_compute_cold_8();
switchD_00121c44_caseD_2:
      ppVar14[-1] = (pthread_t)ggml_graph_compute_thread;
      ggml_graph_compute_cold_7();
      ppVar14[-1] = (pthread_t)&stack0xfffffffffffffff8;
      ppVar14[-2] = (pthread_t)puVar21;
      ppVar14[-3] = (pthread_t)pgVar13;
      sVar16 = __th[6];
      iVar15 = *(int *)(sVar16 + 4);
      while( true ) {
        LOCK();
        piVar1 = (int *)(sVar16 + 8);
        iVar4 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        if (iVar4 == iVar15 + -1) {
          LOCK();
          *(undefined1 *)(__th[6] + 0xc) = 0;
          UNLOCK();
        }
        else {
          while ((*(byte *)(__th[6] + 0xc) & 1) != 0) {
            if ((*(byte *)(__th[6] + 0xd) & 1) != 0) {
              return;
            }
          }
        }
        LOCK();
        *(int *)(__th[6] + 8) = *(int *)(__th[6] + 8) + -1;
        UNLOCK();
        while ((*(byte *)(__th[6] + 0xc) & 1) == 0) {
          if ((*(byte *)(__th[6] + 0xd) & 1) != 0) {
            return;
          }
        }
        if (((*(byte *)(__th[6] + 0xd) & 1) != 0) ||
           (pgVar10 = (ggml_tensor *)__th[5], pgVar10 == (ggml_tensor *)0x0)) break;
        if (*(int *)((long)__th + 0xc) < (int)__th[2]) {
          ppVar14[-4] = 0x12213a;
          ggml_compute_forward((ggml_compute_params *)(__th + 1),pgVar10);
        }
        __th[5] = 0;
        sVar16 = __th[6];
      }
      return;
    }
  }
  local_50 = (ggml_context *)(ulong)((int)local_48 - 1);
  lVar19 = (long)local_50 * 0x38;
  lVar22 = 0;
  do {
    pgVar10 = pgVar6->nodes[lVar22];
    local_80.type = GGML_TASK_INIT;
    local_80.ith = 0;
    local_80.nth = pgVar10->n_tasks;
    pgVar5 = pgVar6->work;
    if (pgVar5 == (ggml_tensor *)0x0) {
      local_80.wsize = 0;
      local_80.wdata = (void *)0x0;
    }
    else {
      local_80.wsize =
           ((long)pgVar5->ne[3] * (long)pgVar5->ne[2] * (long)pgVar5->ne[1] * (long)pgVar5->ne[0] *
           GGML_TYPE_SIZE[pgVar5->type]) / (ulong)(long)GGML_BLCK_SIZE[pgVar5->type];
      local_80.wdata = pgVar5->data;
    }
    ppVar14[-1] = 0x121da6;
    ggml_compute_forward(&local_80,pgVar10);
    if (1 < pgVar10->n_tasks) {
      LOCK();
      iVar15 = local_38 + 1;
      UNLOCK();
      if (local_38 == (int)local_50) {
        LOCK();
        local_34 = local_34 & 0xff00;
        UNLOCK();
      }
      do {
      } while ((local_34 & 1) != 0);
      local_38 = iVar15;
      if (1 < (int)local_48) {
        pgVar5 = pgVar6->work;
        iVar15 = 1;
        lVar17 = 0;
        do {
          iVar4 = pgVar10->n_tasks;
          if (pgVar5 == (ggml_tensor *)0x0) {
            uVar9 = 0;
            pvVar12 = (void *)0x0;
          }
          else {
            uVar9 = ((long)pgVar5->ne[3] * (long)pgVar5->ne[2] *
                     (long)pgVar5->ne[1] * (long)pgVar5->ne[0] * GGML_TYPE_SIZE[pgVar5->type]) /
                    (ulong)(long)GGML_BLCK_SIZE[pgVar5->type];
            pvVar12 = pgVar5->data;
          }
          *(undefined4 *)((long)ppVar20 + lVar17 + 8) = 1;
          *(int *)((long)ppVar20 + lVar17 + 0xc) = iVar15;
          *(int *)((long)ppVar20 + lVar17 + 0x10) = iVar4;
          *(ulong *)((long)ppVar20 + lVar17 + 0x18) = uVar9;
          *(void **)((long)ppVar20 + lVar17 + 0x20) = pvVar12;
          *(ggml_tensor **)((long)ppVar20 + lVar17 + 0x28) = pgVar10;
          lVar17 = lVar17 + 0x38;
          iVar15 = iVar15 + 1;
        } while (lVar19 - lVar17 != 0);
      }
      LOCK();
      local_38 = local_38 + -1;
      UNLOCK();
      do {
      } while (0 < local_38);
      LOCK();
      local_34 = CONCAT11(local_34._1_1_,1);
      UNLOCK();
    }
    local_80.type = GGML_TASK_COMPUTE;
    ppVar14[-1] = 0x121e7d;
    ggml_compute_forward(&local_80,pgVar10);
    if (1 < pgVar10->n_tasks) {
      LOCK();
      UNLOCK();
      if (local_38 == (int)local_50) {
        LOCK();
        local_34 = local_34 & 0xff00;
        UNLOCK();
      }
      do {
      } while ((local_34 & 1) != 0);
      LOCK();
      UNLOCK();
      do {
      } while (local_38 != 0);
      if (1 < pgVar10->n_tasks) {
        LOCK();
        local_38 = 1;
        UNLOCK();
        if ((int)local_50 == 0) {
          LOCK();
          local_34 = local_34 & 0xff00;
          UNLOCK();
        }
        do {
        } while ((local_34 & 1) != 0);
        if (1 < (int)local_48) {
          pgVar5 = pgVar6->work;
          iVar15 = 1;
          lVar17 = 0;
          do {
            iVar4 = pgVar10->n_tasks;
            if (pgVar5 == (ggml_tensor *)0x0) {
              uVar9 = 0;
              pvVar12 = (void *)0x0;
            }
            else {
              uVar9 = ((long)pgVar5->ne[3] * (long)pgVar5->ne[2] *
                       (long)pgVar5->ne[1] * (long)pgVar5->ne[0] * GGML_TYPE_SIZE[pgVar5->type]) /
                      (ulong)(long)GGML_BLCK_SIZE[pgVar5->type];
              pvVar12 = pgVar5->data;
            }
            *(undefined4 *)((long)ppVar20 + lVar17 + 8) = 2;
            *(int *)((long)ppVar20 + lVar17 + 0xc) = iVar15;
            *(int *)((long)ppVar20 + lVar17 + 0x10) = iVar4;
            *(ulong *)((long)ppVar20 + lVar17 + 0x18) = uVar9;
            *(void **)((long)ppVar20 + lVar17 + 0x20) = pvVar12;
            *(ggml_tensor **)((long)ppVar20 + lVar17 + 0x28) = pgVar10;
            lVar17 = lVar17 + 0x38;
            iVar15 = iVar15 + 1;
          } while (lVar19 - lVar17 != 0);
        }
        LOCK();
        local_38 = local_38 + -1;
        UNLOCK();
        do {
        } while (0 < local_38);
        LOCK();
        local_34 = CONCAT11(local_34._1_1_,1);
        UNLOCK();
      }
    }
    local_80.type = GGML_TASK_FINALIZE;
    ppVar14[-1] = 0x121f85;
    ggml_compute_forward(&local_80,pgVar10);
    if (1 < pgVar10->n_tasks) {
      LOCK();
      UNLOCK();
      if (local_38 == (int)local_50) {
        LOCK();
        local_34 = local_34 & 0xff00;
        UNLOCK();
      }
      do {
      } while ((local_34 & 1) != 0);
      LOCK();
      UNLOCK();
      do {
      } while (local_38 != 0);
    }
    pgVar10->perf_runs = pgVar10->perf_runs + 1;
    lVar22 = lVar22 + 1;
  } while (lVar22 < pgVar6->n_nodes);
  goto LAB_00121fd3;
}

Assistant:

void ggml_graph_compute(struct ggml_context * ctx, struct ggml_cgraph * cgraph) {
    if (cgraph->n_threads <= 0) {
        cgraph->n_threads = 8;
    }

    const int n_threads = cgraph->n_threads;

    struct ggml_compute_state_shared state_shared = {
        /*.spin      =*/ GGML_LOCK_INITIALIZER,
        /*.n_threads =*/ n_threads,
        /*.n_ready   =*/ 0,
        /*.has_work  =*/ false,
        /*.stop      =*/ false,
    };
    struct ggml_compute_state * workers = n_threads > 1 ? alloca(sizeof(struct ggml_compute_state)*(n_threads - 1)) : NULL;

    // create thread pool
    if (n_threads > 1) {
        ggml_lock_init(&state_shared.spin);

        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            workers[j] = (struct ggml_compute_state) {
                .thrd   = 0,
                .params = {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = n_threads,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                },
                .node   = NULL,
                .shared = &state_shared,
            };

            int rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_thread, &workers[j]);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }
    }

    // initialize tasks + work buffer
    {
        size_t work_size = 0;

        // thread scheduling for the different operations
        for (int i = 0; i < cgraph->n_nodes; i++) {
            struct ggml_tensor * node = cgraph->nodes[i];

            switch (node->op) {
                case GGML_OP_DUP:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_ADD:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SUB:
                case GGML_OP_MUL:
                case GGML_OP_DIV:
                case GGML_OP_SQR:
                case GGML_OP_SQRT:
                case GGML_OP_SUM:
                case GGML_OP_MEAN:
                case GGML_OP_REPEAT:
                case GGML_OP_ABS:
                case GGML_OP_SGN:
                case GGML_OP_NEG:
                case GGML_OP_STEP:
                case GGML_OP_RELU:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_GELU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SILU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_NORM:
                case GGML_OP_RMS_NORM:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        node->n_tasks = n_threads;

                        // TODO: use different scheduling for different matrix sizes
                        //const int nr0 = ggml_nrows(node->src0);
                        //const int nr1 = ggml_nrows(node->src1);

                        //node->n_tasks = MIN(n_threads, MAX(1, nr0/128));
                        //printf("nr0 = %8d, nr1 = %8d, nr0*nr1 = %8d, n_tasks = %d\n", nr0, nr1, nr0*nr1, node->n_tasks);

                        size_t cur = 0;

                        // TODO: better way to determine if the matrix is transposed
                        if (node->src0->nb[1] < node->src0->nb[0]) {
                            cur = ggml_nbytes(node)*node->n_tasks; // TODO: this can become (n_tasks-1)
                                                                   // TODO: overestimated by factor of x2 for FP16
                        } else {
                            if (node->src0->type == GGML_TYPE_F16 &&
                                node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1; // TODO: this actually is doing nothing
                                                       //       the threads are still spinning
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src0: ne0 = %d, ne1 = %d, ne = %d\n", node->src0->ne[0], node->src0->ne[1], node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src1: ne0 = %d, ne1 = %d, ne = %d\n", node->src1->ne[0], node->src1->ne[1], node->src1->ne[0]*node->src1->ne[1]);
                                    //printf("cur = %zu\n", cur);
                                } else {
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
                                }
#else
                                cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
#endif
                            } else if (node->src0->type == GGML_TYPE_F32 &&
                                       node->src1->type == GGML_TYPE_F32) {
                                cur = 0;
                            } else if (node->src0->type == GGML_TYPE_Q4_0 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
#endif
                            } else if (node->src0->type == GGML_TYPE_Q4_1 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
#endif
                            } else {
                                GGML_ASSERT(false);
                            }
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_SCALE:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_CPY:
                case GGML_OP_RESHAPE:
                case GGML_OP_VIEW:
                case GGML_OP_PERMUTE:
                case GGML_OP_TRANSPOSE:
                case GGML_OP_GET_ROWS:
                case GGML_OP_DIAG_MASK_INF:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_SOFT_MAX:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_ROPE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_CONV_1D_1S:
                case GGML_OP_CONV_1D_2S:
                    {
                        node->n_tasks = n_threads;

                        GGML_ASSERT(node->src0->ne[3] == 1);
                        GGML_ASSERT(node->src1->ne[2] == 1);
                        GGML_ASSERT(node->src1->ne[3] == 1);

                        size_t cur = 0;
                        const int nk = node->src0->ne[0];

                        if (node->src0->type == GGML_TYPE_F16 &&
                            node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(ggml_fp16_t)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else if (node->src0->type == GGML_TYPE_F32 &&
                                   node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(float)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else {
                            GGML_ASSERT(false);
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_ATTN:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        const int ne11 = ggml_up(node->src1->ne[1], GGML_SOFT_MAX_UNROLL);

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_FF:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_NONE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ASSERT(false);
                    } break;
            }
        }

        if (cgraph->work != NULL && work_size > cgraph->work_size) {
            GGML_ASSERT(false); // TODO: better handling
        }

        if (work_size > 0 && cgraph->work == NULL) {
            cgraph->work_size = work_size + CACHE_LINE_SIZE*(n_threads - 1);

            GGML_PRINT_DEBUG("%s: allocating work buffer for graph (%zu bytes)\n", __func__, cgraph->work_size);
            cgraph->work = ggml_new_tensor_1d(ctx, GGML_TYPE_I8, cgraph->work_size);
        }
    }

    const int64_t perf_start_cycles  = ggml_perf_cycles();
    const int64_t perf_start_time_us = ggml_perf_time_us();

    for (int i = 0; i < cgraph->n_nodes; i++) {
        GGML_PRINT_DEBUG_5("%s: %d/%d\n", __func__, i, cgraph->n_nodes);

        struct ggml_tensor * node = cgraph->nodes[i];

        // TODO: this could be used to avoid unnecessary computations, but it needs to be improved
        //if (node->grad == NULL && node->perf_runs > 0) {
        //    continue;
        //}

        const int64_t perf_node_start_cycles  = ggml_perf_cycles();
        const int64_t perf_node_start_time_us = ggml_perf_time_us();

        // INIT
        struct ggml_compute_params params = {
            /*.type  =*/ GGML_TASK_INIT,
            /*.ith   =*/ 0,
            /*.nth   =*/ node->n_tasks,
            /*.wsize =*/ cgraph->work ? ggml_nbytes(cgraph->work) : 0,
            /*.wdata =*/ cgraph->work ? cgraph->work->data : NULL,
        };

        ggml_compute_forward(&params, node);

        // COMPUTE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_COMPUTE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // FINALIZE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_FINALIZE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_FINALIZE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // performance stats (node)
        {
            int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_node_start_cycles;
            int64_t perf_time_us_cur = ggml_perf_time_us() - perf_node_start_time_us;

            node->perf_runs++;
            node->perf_cycles  += perf_cycles_cur;
            node->perf_time_us += perf_time_us_cur;
        }
    }

    // join thread pool
    if (n_threads > 1) {
        atomic_store(&state_shared.stop, true);
        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            int rc = ggml_thread_join(workers[j].thrd, NULL);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }

        ggml_lock_destroy(&state_shared.spin);
    }

    // performance stats (graph)
    {
        int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_start_cycles;
        int64_t perf_time_us_cur = ggml_perf_time_us() - perf_start_time_us;

        cgraph->perf_runs++;
        cgraph->perf_cycles  += perf_cycles_cur;
        cgraph->perf_time_us += perf_time_us_cur;

        GGML_PRINT_DEBUG("%s: perf (%d) - cpu = %.3f / %.3f ms, wall = %.3f / %.3f ms\n",
                __func__, cgraph->perf_runs,
                (double) perf_cycles_cur      / (double) ggml_cycles_per_ms(),
                (double) cgraph->perf_cycles  / (double) ggml_cycles_per_ms() / (double) cgraph->perf_runs,
                (double) perf_time_us_cur     / 1000.0,
                (double) cgraph->perf_time_us / 1000.0 / cgraph->perf_runs);
    }
}